

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SBG.h
# Opt level: O3

int GetFrameSBG(SBG *pSBG,SBGDATA *pSBGData)

{
  byte bVar1;
  byte bVar2;
  ushort uVar3;
  int iVar4;
  ulong uVar5;
  ulong uVar6;
  int iVar7;
  ssize_t sVar8;
  ushort uVar9;
  uint uVar10;
  long lVar11;
  ulong uVar12;
  uint uVar13;
  ulong uVar14;
  uint uVar15;
  long lVar16;
  char cVar17;
  short sVar18;
  uchar *frame;
  size_t __n;
  CHRONO chrono;
  uchar recvbuf [8192];
  timespec local_2090;
  timespec local_2080;
  undefined8 local_2070;
  undefined8 uStack_2068;
  long local_2060;
  long lStack_2058;
  timespec local_2050;
  int local_2040;
  uchar local_2038 [8200];
  
  iVar7 = clock_getres(4,&local_2050);
  if ((iVar7 == 0) && (iVar7 = clock_gettime(4,&local_2080), iVar7 == 0)) {
    local_2040 = 0;
    local_2070 = 0;
    uStack_2068 = 0;
    local_2060 = 0;
    lStack_2058 = 0;
  }
  uVar14 = 0;
  memset(local_2038,0,0x2000);
  iVar7 = (pSBG->RS232Port).DevType;
  if (iVar7 - 1U < 4) {
    iVar7 = (pSBG->RS232Port).s;
    do {
      sVar8 = recv(iVar7,local_2038 + uVar14,(ulong)(9 - (int)uVar14),0);
      if ((int)sVar8 < 1) goto LAB_001a52a3;
      uVar13 = (int)uVar14 + (int)sVar8;
      uVar14 = (ulong)uVar13;
    } while ((int)uVar13 < 9);
  }
  else {
    if (iVar7 != 0) {
LAB_001a52a3:
      puts("Error reading data from a SBG. ");
      return 1;
    }
    iVar7 = *(int *)&(pSBG->RS232Port).hDev;
    uVar14 = 0;
    do {
      sVar8 = read(iVar7,local_2038 + uVar14,(ulong)(9 - (int)uVar14));
      if ((int)sVar8 < 1) goto LAB_001a52a3;
      uVar13 = (int)uVar14 + (int)sVar8;
      uVar14 = (ulong)uVar13;
    } while (uVar13 < 9);
  }
  iVar7 = 9;
  do {
    uVar13 = 0;
    frame = local_2038;
    do {
      uVar10 = iVar7 - uVar13;
      if ((int)uVar10 < 9) {
        uVar15 = 9;
LAB_001a50ed:
        uVar15 = uVar15 - uVar10;
        goto LAB_001a50ef;
      }
      uVar15 = 1;
      if ((*frame == 0xff) && (frame[1] == 'Z')) {
        uVar3 = *(ushort *)(frame + 4);
        lVar11 = (ulong)uVar3 + 9;
        uVar15 = (uint)lVar11;
        if (uVar10 < uVar15) goto LAB_001a50ed;
        uVar9 = (short)lVar11 - 5;
        if (uVar9 == 0) {
          sVar18 = 0;
        }
        else {
          uVar12 = 0;
          uVar14 = 0;
          do {
            uVar14 = (ulong)((uint)uVar14 ^ (uint)frame[uVar12 + 2]);
            cVar17 = '\b';
            do {
              uVar5 = (uVar14 & 0xffff) >> 1;
              uVar6 = uVar14 & 1;
              uVar14 = (ulong)((uint)uVar5 ^ 0xffff8408);
              if (uVar6 == 0) {
                uVar14 = uVar5;
              }
              sVar18 = (short)uVar14;
              cVar17 = cVar17 + -1;
            } while (cVar17 != '\0');
            uVar12 = uVar12 + 1;
          } while (uVar12 != uVar9);
        }
        if (*(short *)(frame + (ulong)uVar3 + 6) == sVar18) {
          bVar1 = frame[2];
          bVar2 = frame[3];
          if (0 < (int)((iVar7 - (uVar13 + uVar3)) + -9)) {
            puts("Warning getting data from a SBG : Unexpected data after a frame. ");
          }
          iVar7 = ProcessFrameSBG(pSBG,frame,uVar15,(uint)bVar1,(uint)bVar2,pSBGData);
          return (uint)(iVar7 != 0);
        }
        puts("Warning : SBG CRC error. ");
        uVar15 = 2;
      }
      frame = frame + uVar15;
      uVar13 = uVar13 + uVar15;
      uVar10 = iVar7 - uVar13;
    } while (uVar10 != 0 && (int)uVar13 <= iVar7);
    uVar15 = 9;
    if ((int)uVar13 < 9) {
      uVar15 = uVar13;
    }
LAB_001a50ef:
    __n = (size_t)(int)uVar10;
    memmove(local_2038,local_2038 + (int)uVar13,__n);
    iVar7 = uVar10 + uVar15;
    if (0x1fff < iVar7) {
      puts("Error reading data from a SBG : Invalid data. ");
      return 4;
    }
    iVar4 = (pSBG->RS232Port).DevType;
    if (iVar4 - 1U < 4) {
      if (0 < (int)uVar15) {
        iVar4 = (pSBG->RS232Port).s;
        uVar14 = 0;
        do {
          sVar8 = recv(iVar4,local_2038 + uVar14 + __n,(long)(int)(uVar15 - (int)uVar14),0);
          if ((int)sVar8 < 1) goto LAB_001a52a3;
          uVar13 = (int)uVar14 + (int)sVar8;
          uVar14 = (ulong)uVar13;
        } while ((int)uVar13 < (int)uVar15);
      }
    }
    else {
      if (iVar4 != 0) goto LAB_001a52a3;
      if (uVar15 != 0) {
        iVar4 = *(int *)&(pSBG->RS232Port).hDev;
        uVar14 = 0;
        do {
          sVar8 = read(iVar4,local_2038 + uVar14 + __n,(ulong)(uVar15 - (int)uVar14));
          if ((int)sVar8 < 1) goto LAB_001a52a3;
          uVar13 = (int)uVar14 + (int)sVar8;
          uVar14 = (ulong)uVar13;
        } while (uVar13 < uVar15);
      }
    }
    lVar16 = local_2060;
    lVar11 = lStack_2058;
    if (local_2040 == 0) {
      clock_gettime(4,&local_2090);
      lVar16 = ((local_2090.tv_sec + local_2060) - local_2080.tv_sec) +
               (local_2090.tv_nsec + lStack_2058) / 1000000000;
      lVar11 = (local_2090.tv_nsec + lStack_2058) % 1000000000 - local_2080.tv_nsec;
      if (lVar11 < 0) {
        lVar16 = lVar16 + ~((ulong)-lVar11 / 1000000000);
        lVar11 = lVar11 + 1000000000 + ((ulong)-lVar11 / 1000000000) * 1000000000;
      }
    }
    if (4.0 < (double)lVar11 / 1000000000.0 + (double)lVar16) {
      puts("Error reading data from a SBG : Frame timeout. ");
      return 2;
    }
  } while( true );
}

Assistant:

inline int GetFrameSBG(SBG* pSBG, SBGDATA* pSBGData)
{
	unsigned char recvbuf[MAX_NB_BYTES_SBG];
	int BytesReceived = 0, recvbuflen = 0, res = EXIT_FAILURE, nbBytesToRequest = 0, nbBytesDiscarded = 0;
	unsigned char* ptr = NULL;
	int framelen = 0;
	int mid = 0, mclass = 0;
	CHRONO chrono;

	StartChrono(&chrono);

	// Prepare the buffers.
	memset(recvbuf, 0, sizeof(recvbuf));
	recvbuflen = MAX_NB_BYTES_SBG-1; // The last character must be a 0 to be a valid string for sscanf.
	BytesReceived = 0;

	// Suppose that there are not so many data to discard.
	// First try to get directly the desired message...

	nbBytesToRequest = MIN_FRAME_LEN_SBG;
	if (ReadAllRS232Port(&pSBG->RS232Port, recvbuf, nbBytesToRequest) != EXIT_SUCCESS)
	{
		printf("Error reading data from a SBG. \n");
		return EXIT_FAILURE;
	}
	BytesReceived += nbBytesToRequest;
	
	for (;;)
	{
		res = FindFrameSBG(recvbuf, BytesReceived, &mid, &mclass, &framelen, &nbBytesToRequest, &ptr, &nbBytesDiscarded);
		if (res == EXIT_SUCCESS) break;
		if (res == EXIT_FAILURE)
		{
			nbBytesToRequest = min(MIN_FRAME_LEN_SBG, nbBytesDiscarded);
		}	
		memmove(recvbuf, recvbuf+nbBytesDiscarded, BytesReceived-nbBytesDiscarded);
		BytesReceived -= nbBytesDiscarded;
		if (BytesReceived+nbBytesToRequest > recvbuflen)
		{
			printf("Error reading data from a SBG : Invalid data. \n");
			return EXIT_INVALID_DATA;
		}
		if (ReadAllRS232Port(&pSBG->RS232Port, recvbuf+BytesReceived, nbBytesToRequest) != EXIT_SUCCESS)
		{
			printf("Error reading data from a SBG. \n");
			return EXIT_FAILURE;
		}
		BytesReceived += nbBytesToRequest;
		if (GetTimeElapsedChronoQuick(&chrono) > TIMEOUT_MESSAGE_SBG)
		{
			printf("Error reading data from a SBG : Frame timeout. \n");
			return EXIT_TIMEOUT;
		}
	}

	if (BytesReceived-nbBytesDiscarded-framelen > 0)
	{
		printf("Warning getting data from a SBG : Unexpected data after a frame. \n");
	}

	//// Get data bytes.

	//memset(databuf, 0, databuflen);

	//// Check the number of data bytes before copy.
	//if (databuflen < *pframelen)
	//{
	//	printf("Error getting data from a SBG : Too small data buffer. \n");
	//	return EXIT_FAILURE;
	//}

	//// Copy the data bytes of the message.
	//if (*pframelen > 0)
	//{
	//	memcpy(databuf, ptr, *pframelen);
	//}

	if (ProcessFrameSBG(pSBG, ptr, framelen, mid, mclass, pSBGData) != EXIT_SUCCESS)
	{
		return EXIT_FAILURE;
	}

	return EXIT_SUCCESS;
}